

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_1::WatWriter::WriteClose(WatWriter *this,NextChar next_char)

{
  int iVar1;
  
  if (this->next_char_ != ForceNewline) {
    this->next_char_ = None;
  }
  iVar1 = this->indent_;
  this->indent_ = iVar1 + -2;
  if (1 < iVar1) {
    WritePuts(this,")",next_char);
    return;
  }
  __assert_fail("indent_ >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wat-writer.cc"
                ,0xd1,"void wabt::(anonymous namespace)::WatWriter::Dedent()");
}

Assistant:

void WatWriter::WriteClose(NextChar next_char) {
  if (next_char_ != NextChar::ForceNewline) {
    next_char_ = NextChar::None;
  }
  Dedent();
  WritePuts(")", next_char);
}